

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

char * helicsBrokerGetIdentifier(HelicsBroker broker)

{
  char *pcVar1;
  undefined8 *puVar2;
  
  pcVar1 = "";
  if (((broker != (HelicsBroker)0x0) && (*(int *)((long)broker + 0x14) == -0x5cb982e0)) &&
     (*broker != (long *)0x0)) {
    puVar2 = (undefined8 *)(**(code **)(**broker + 0x58))();
    pcVar1 = (char *)*puVar2;
  }
  return pcVar1;
}

Assistant:

const char* helicsBrokerGetIdentifier(HelicsBroker broker)
{
    auto* brk = getBroker(broker, nullptr);
    if (brk == nullptr) {
        return nullstrPtr;
    }
    const auto& ident = brk->getIdentifier();
    return ident.c_str();
}